

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O0

NLW2_SOLHandler_C * NLW2_MakeSOLHandler_C_Default(void)

{
  NLW2_SOLHandler_C *in_RDI;
  NLW2_SOLHandler_C *result;
  
  memset(in_RDI,0,0x50);
  in_RDI->p_user_data_ = (void *)0x0;
  in_RDI->Header = (_func_NLHeader_C_void_ptr *)0x0;
  in_RDI->OnSolveMessage = NLW2_OnSolveMessage_C_Default;
  in_RDI->OnAMPLOptions = NLW2_OnAMPLOptions_C_Default;
  in_RDI->OnDualSolution = NLW2_OnDualSolution_C_Default;
  in_RDI->OnPrimalSolution = NLW2_OnPrimalSolution_C_Default;
  in_RDI->OnObjno = NLW2_OnObjno_C_Default;
  in_RDI->OnSolveCode = NLW2_OnSolveCode_C_Default;
  in_RDI->OnIntSuffix = NLW2_OnIntSuffix_C_Default;
  in_RDI->OnDblSuffix = NLW2_OnDblSuffix_C_Default;
  return in_RDI;
}

Assistant:

NLW2_SOLHandler_C NLW2_MakeSOLHandler_C_Default(void) {
  NLW2_SOLHandler_C result;

  std::memset(&result, 0, sizeof(result));       // all 0

  result.p_user_data_ = NULL;

  result.Header = NULL;           // User should provide this

  result.OnSolveMessage = NLW2_OnSolveMessage_C_Default;
  result.OnAMPLOptions = NLW2_OnAMPLOptions_C_Default;
  result.OnDualSolution = NLW2_OnDualSolution_C_Default;
  result.OnPrimalSolution = NLW2_OnPrimalSolution_C_Default;
  result.OnObjno = NLW2_OnObjno_C_Default;
  result.OnSolveCode = NLW2_OnSolveCode_C_Default;
  result.OnIntSuffix = NLW2_OnIntSuffix_C_Default;
  result.OnDblSuffix = NLW2_OnDblSuffix_C_Default;

  return result;
}